

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Native::Print(BasicValue *__return_storage_ptr__,
                  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  bool bVar1;
  reference this;
  ostream *poVar2;
  shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_> local_68;
  string local_58;
  reference local_38;
  BasicValue *Arg;
  iterator __end1;
  iterator __begin1;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *__range1;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args_local;
  
  __end1 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::begin(Args);
  Arg = (BasicValue *)
        std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::end(Args);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&Arg);
    if (!bVar1) break;
    this = std::_List_iterator<cvm::BasicValue>::operator*(&__end1);
    local_38 = this;
    std::shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_>::shared_ptr
              (&local_68,(nullptr_t)0x0);
    BasicValue::toString_abi_cxx11_(&local_58,this,&local_68);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_58);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string((string *)&local_58);
    std::shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_>::~shared_ptr
              (&local_68);
    std::_List_iterator<cvm::BasicValue>::operator++(&__end1);
  }
  BasicValue::BasicValue(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

BasicValue Native::Print(std::list<BasicValue> &Args) {
  for (auto &Arg : Args) {
    std::cout << Arg.toString() << " ";
  }
  return BasicValue();
}